

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::cmComputeLinkInformation
          (cmComputeLinkInformation *this,cmGeneratorTarget *target,string *config)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  cmGlobalGenerator *pcVar4;
  pointer pcVar5;
  cmGeneratorTarget *this_00;
  undefined8 uVar6;
  bool bVar7;
  TargetType TVar8;
  PolicyStatus PVar9;
  cmMakefile *pcVar10;
  cmLocalGenerator *pcVar11;
  cmState *this_01;
  cmOrderDirectories *pcVar12;
  cmValue cVar13;
  long *plVar14;
  string *psVar15;
  size_type *psVar16;
  pointer __p;
  char *pcVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  _Alloc_node __an;
  string rtSepVar;
  string rlVar;
  undefined1 local_328 [32];
  LibraryFeatureDescriptor local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
  *local_258;
  unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *local_250;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_248;
  unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *local_240;
  unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *local_238;
  string *local_230;
  string *local_228;
  string *local_220;
  string *local_218;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_210;
  string local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  string *local_180;
  string *local_178;
  string *local_170;
  string *local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_160;
  string *local_158;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  p_Var1 = &(this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->Items).
  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Items).
  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Items).
  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Directories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Directories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Directories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FrameworkPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FrameworkPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FrameworkPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->RuntimeSearchPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RuntimeSearchPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RuntimeSearchPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->RuntimeDLLs).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RuntimeDLLs).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RuntimeDLLs).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Target = target;
  pcVar10 = cmTarget::GetMakefile(target->Target);
  this->Makefile = pcVar10;
  pcVar11 = cmGeneratorTarget::GetLocalGenerator(target);
  pcVar4 = pcVar11->GlobalGenerator;
  this->GlobalGenerator = pcVar4;
  this->CMakeInstance = pcVar4->CMakeInstance;
  local_158 = &this->Config;
  local_188 = &(this->Config).field_2;
  (this->Config)._M_dataplus._M_p = (pointer)local_188;
  pcVar5 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_158,pcVar5,pcVar5 + config->_M_string_length);
  local_260 = &this->LinkLanguage;
  local_190 = &(this->LinkLanguage).field_2;
  (this->LinkLanguage)._M_dataplus._M_p = (pointer)local_190;
  (this->LinkLanguage)._M_string_length = 0;
  (this->LinkLanguage).field_2._M_local_buf[0] = '\0';
  (this->LoaderFlag).Value = (string *)0x0;
  local_218 = (string *)&this->LibLinkFlag;
  local_198 = &(this->LibLinkFlag).field_2;
  (this->LibLinkFlag)._M_dataplus._M_p = (pointer)local_198;
  (this->LibLinkFlag)._M_string_length = 0;
  (this->LibLinkFlag).field_2._M_local_buf[0] = '\0';
  local_1a0 = &(this->LibLinkFileFlag).field_2;
  (this->LibLinkFileFlag)._M_dataplus._M_p = (pointer)local_1a0;
  (this->LibLinkFileFlag)._M_string_length = 0;
  (this->LibLinkFileFlag).field_2._M_local_buf[0] = '\0';
  local_1a8 = &(this->ObjLinkFileFlag).field_2;
  (this->ObjLinkFileFlag)._M_dataplus._M_p = (pointer)local_1a8;
  (this->ObjLinkFileFlag)._M_string_length = 0;
  (this->ObjLinkFileFlag).field_2._M_local_buf[0] = '\0';
  local_1b0 = &(this->LibLinkSuffix).field_2;
  (this->LibLinkSuffix)._M_dataplus._M_p = (pointer)local_1b0;
  (this->LibLinkSuffix)._M_string_length = 0;
  (this->LibLinkSuffix).field_2._M_local_buf[0] = '\0';
  local_1b8 = &(this->RuntimeFlag).field_2;
  (this->RuntimeFlag)._M_dataplus._M_p = (pointer)local_1b8;
  (this->RuntimeFlag)._M_string_length = 0;
  (this->RuntimeFlag).field_2._M_local_buf[0] = '\0';
  local_1c0 = &(this->RuntimeSep).field_2;
  (this->RuntimeSep)._M_dataplus._M_p = (pointer)local_1c0;
  (this->RuntimeSep)._M_string_length = 0;
  (this->RuntimeSep).field_2._M_local_buf[0] = '\0';
  local_1c8 = &(this->RuntimeAlways).field_2;
  (this->RuntimeAlways)._M_dataplus._M_p = (pointer)local_1c8;
  (this->RuntimeAlways)._M_string_length = 0;
  (this->RuntimeAlways).field_2._M_local_buf[0] = '\0';
  local_1d0 = &(this->RPathLinkFlag).field_2;
  (this->RPathLinkFlag)._M_dataplus._M_p = (pointer)local_1d0;
  (this->RPathLinkFlag)._M_string_length = 0;
  (this->RPathLinkFlag).field_2._M_local_buf[0] = '\0';
  local_1d8 = &(this->StaticLinkTypeFlag).field_2;
  (this->StaticLinkTypeFlag)._M_dataplus._M_p = (pointer)local_1d8;
  (this->StaticLinkTypeFlag)._M_string_length = 0;
  (this->StaticLinkTypeFlag).field_2._M_local_buf[0] = '\0';
  local_1e0 = &(this->SharedLinkTypeFlag).field_2;
  (this->SharedLinkTypeFlag)._M_dataplus._M_p = (pointer)local_1e0;
  (this->SharedLinkTypeFlag)._M_string_length = 0;
  (this->SharedLinkTypeFlag).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SharedLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SharedLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->StaticLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SharedLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->StaticLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->StaticLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_220 = (string *)&this->LibLinkFileFlag;
  (this->ExtractStaticLibraryName).regmust = (char *)0x0;
  (this->ExtractStaticLibraryName).program = (char *)0x0;
  (this->ExtractStaticLibraryName).progsize = 0;
  (this->ExtractSharedLibraryName).regmust = (char *)0x0;
  (this->ExtractSharedLibraryName).program = (char *)0x0;
  (this->ExtractSharedLibraryName).progsize = 0;
  local_230 = (string *)&this->ObjLinkFileFlag;
  local_228 = (string *)&this->LibLinkSuffix;
  local_168 = (string *)&this->RuntimeFlag;
  local_170 = (string *)&this->RuntimeSep;
  local_178 = (string *)&this->RuntimeAlways;
  local_180 = (string *)&this->RPathLinkFlag;
  memset(&this->ExtractSharedLibraryName,0,0xaa);
  (this->ExtractAnyLibraryName).regmust = (char *)0x0;
  (this->ExtractAnyLibraryName).program = (char *)0x0;
  (this->ExtractAnyLibraryName).progsize = 0;
  memset(&this->ExtractAnyLibraryName,0,0xaa);
  paVar2 = &(this->SharedRegexString).field_2;
  memset(&(this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0xb2);
  (this->SharedRegexString)._M_dataplus._M_p = (pointer)paVar2;
  (this->SharedRegexString)._M_string_length = 0;
  (this->SharedRegexString).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header;
  (this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_238 = &this->OrderLinkerSearchPath;
  local_248 = &this->ImplicitLinkDirs;
  p_Var1 = &(this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OrderLinkerSearchPath)._M_t.
  super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>._M_t.
  super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>.
  super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl = (cmOrderDirectories *)0x0;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_160 = &this->RuntimeLinkDirs;
  local_210 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->OldLinkDirMask;
  p_Var1 = &(this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->RuntimeLinkDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RuntimeLinkDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->RuntimeLinkDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var3 = &(this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OldLinkDirItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OldLinkDirItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OldLinkDirItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OldUserFlagItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OldUserFlagItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OldUserFlagItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header
  ;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  local_250 = &this->OrderDependentRPath;
  local_240 = &this->OrderRuntimeSearchPath;
  local_258 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
               *)&this->LibraryFeatureDescriptors;
  p_Var3 = &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header;
  (this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OrderDependentRPath)._M_t.
  super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>._M_t.
  super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>.
  super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl = (cmOrderDirectories *)0x0;
  (this->OrderRuntimeSearchPath)._M_t.
  super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>._M_t.
  super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>.
  super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl = (cmOrderDirectories *)0x0;
  (this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header;
  (this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1e8 = paVar2;
  this_01 = cmMakefile::GetState(this->Makefile);
  local_308.super_FeatureDescriptor.Name._M_dataplus._M_p =
       (pointer)&local_308.super_FeatureDescriptor.Name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,"FIND_LIBRARY_USE_OPENBSD_VERSIONING","");
  bVar7 = cmState::GetGlobalPropertyAsBool(this_01,(string *)&local_308);
  this->OpenBSD = bVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
      &local_308.super_FeatureDescriptor.Name.field_2) {
    operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                    local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
  }
  pcVar12 = (cmOrderDirectories *)operator_new(0x2d0);
  cmOrderDirectories::cmOrderDirectories(pcVar12,this->GlobalGenerator,target,"linker search path");
  local_308.super_FeatureDescriptor.Name._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::reset
            ((__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)
             local_238,pcVar12);
  std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::~unique_ptr
            ((unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)&local_308)
  ;
  pcVar12 = (cmOrderDirectories *)operator_new(0x2d0);
  cmOrderDirectories::cmOrderDirectories(pcVar12,this->GlobalGenerator,target,"runtime search path")
  ;
  local_308.super_FeatureDescriptor.Name._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::reset
            ((__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)
             local_240,pcVar12);
  std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::~unique_ptr
            ((unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)&local_308)
  ;
  cmGeneratorTarget::GetLinkerLanguage((string *)&local_308,this->Target,config);
  std::__cxx11::string::operator=((string *)local_260,(string *)&local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
      &local_308.super_FeatureDescriptor.Name.field_2) {
    operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                    local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
  }
  if ((this->LinkLanguage)._M_string_length != 0) {
    this_00 = this->Target;
    local_308.super_FeatureDescriptor.Name._M_dataplus._M_p =
         (pointer)&local_308.super_FeatureDescriptor.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,"LINK_DEPENDS_NO_SHARED","");
    bVar7 = cmGeneratorTarget::GetPropertyAsBool(this_00,(string *)&local_308);
    this->LinkDependsNoShared = bVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
        &local_308.super_FeatureDescriptor.Name.field_2) {
      operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
    }
    bVar7 = cmGeneratorTarget::IsDLLPlatform(this->Target);
    if (!bVar7) {
      TVar8 = cmGeneratorTarget::GetType(this->Target);
      if (TVar8 == MODULE_LIBRARY) {
        local_308.super_FeatureDescriptor.Name.field_2._8_8_ = (this->LinkLanguage)._M_dataplus._M_p
        ;
        local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity =
             (this->LinkLanguage)._M_string_length;
        local_308.super_FeatureDescriptor.Name._M_dataplus._M_p = (pointer)0x1b;
        local_308.super_FeatureDescriptor.Name._M_string_length = 0x71cfeb;
        local_308.super_FeatureDescriptor.Supported = true;
        local_308.super_FeatureDescriptor._33_7_ = 0;
        local_308.super_FeatureDescriptor.Prefix._M_dataplus._M_p = "_FLAG";
        views._M_len = 3;
        views._M_array = (iterator)&local_308;
        cmCatViews_abi_cxx11_((string *)local_328,views);
        cVar13 = cmMakefile::GetDefinition(this->Makefile,(string *)local_328);
        (this->LoaderFlag).Value = cVar13.Value;
        if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
          operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
        }
      }
    }
    pcVar10 = this->Makefile;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328,
                   "CMAKE_",local_260);
    plVar14 = (long *)std::__cxx11::string::append(local_328);
    local_308.super_FeatureDescriptor.Name._M_dataplus._M_p =
         (pointer)&local_308.super_FeatureDescriptor.Name.field_2;
    psVar16 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity = *psVar16;
      local_308.super_FeatureDescriptor.Name.field_2._8_8_ = plVar14[3];
    }
    else {
      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity = *psVar16;
      local_308.super_FeatureDescriptor.Name._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_308.super_FeatureDescriptor.Name._M_string_length = plVar14[1];
    *plVar14 = (long)psVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    cVar13 = cmMakefile::GetDefinition(pcVar10,(string *)&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
        &local_308.super_FeatureDescriptor.Name.field_2) {
      operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    if (cVar13.Value == (string *)0x0) {
      pcVar10 = this->Makefile;
      local_308.super_FeatureDescriptor.Name._M_dataplus._M_p =
           (pointer)&local_308.super_FeatureDescriptor.Name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"CMAKE_LINK_LIBRARY_FLAG","");
      cmMakefile::GetSafeDefinition(pcVar10,(string *)&local_308);
      std::__cxx11::string::_M_assign(local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.Name.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign(local_218);
    }
    pcVar10 = this->Makefile;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328,
                   "CMAKE_",local_260);
    plVar14 = (long *)std::__cxx11::string::append(local_328);
    local_308.super_FeatureDescriptor.Name._M_dataplus._M_p =
         (pointer)&local_308.super_FeatureDescriptor.Name.field_2;
    psVar16 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity = *psVar16;
      local_308.super_FeatureDescriptor.Name.field_2._8_8_ = plVar14[3];
    }
    else {
      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity = *psVar16;
      local_308.super_FeatureDescriptor.Name._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_308.super_FeatureDescriptor.Name._M_string_length = plVar14[1];
    *plVar14 = (long)psVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    cVar13 = cmMakefile::GetDefinition(pcVar10,(string *)&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
        &local_308.super_FeatureDescriptor.Name.field_2) {
      operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    if (cVar13.Value == (string *)0x0) {
      pcVar10 = this->Makefile;
      local_308.super_FeatureDescriptor.Name._M_dataplus._M_p =
           (pointer)&local_308.super_FeatureDescriptor.Name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"CMAKE_LINK_LIBRARY_FILE_FLAG","");
      cmMakefile::GetSafeDefinition(pcVar10,(string *)&local_308);
      std::__cxx11::string::_M_assign(local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.Name.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign(local_220);
    }
    pcVar10 = this->Makefile;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328,
                   "CMAKE_",local_260);
    plVar14 = (long *)std::__cxx11::string::append(local_328);
    local_308.super_FeatureDescriptor.Name._M_dataplus._M_p =
         (pointer)&local_308.super_FeatureDescriptor.Name.field_2;
    psVar16 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity = *psVar16;
      local_308.super_FeatureDescriptor.Name.field_2._8_8_ = plVar14[3];
    }
    else {
      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity = *psVar16;
      local_308.super_FeatureDescriptor.Name._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_308.super_FeatureDescriptor.Name._M_string_length = plVar14[1];
    *plVar14 = (long)psVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    cVar13 = cmMakefile::GetDefinition(pcVar10,(string *)&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
        &local_308.super_FeatureDescriptor.Name.field_2) {
      operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    if (cVar13.Value == (string *)0x0) {
      pcVar10 = this->Makefile;
      local_308.super_FeatureDescriptor.Name._M_dataplus._M_p =
           (pointer)&local_308.super_FeatureDescriptor.Name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"CMAKE_LINK_LIBRARY_SUFFIX","");
      cmMakefile::GetSafeDefinition(pcVar10,(string *)&local_308);
      std::__cxx11::string::_M_assign(local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.Name.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign(local_228);
    }
    pcVar10 = this->Makefile;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328,
                   "CMAKE_",local_260);
    plVar14 = (long *)std::__cxx11::string::append(local_328);
    local_308.super_FeatureDescriptor.Name._M_dataplus._M_p =
         (pointer)&local_308.super_FeatureDescriptor.Name.field_2;
    psVar16 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity = *psVar16;
      local_308.super_FeatureDescriptor.Name.field_2._8_8_ = plVar14[3];
    }
    else {
      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity = *psVar16;
      local_308.super_FeatureDescriptor.Name._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_308.super_FeatureDescriptor.Name._M_string_length = plVar14[1];
    *plVar14 = (long)psVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    cVar13 = cmMakefile::GetDefinition(pcVar10,(string *)&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
        &local_308.super_FeatureDescriptor.Name.field_2) {
      operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    if (cVar13.Value == (string *)0x0) {
      pcVar10 = this->Makefile;
      local_308.super_FeatureDescriptor.Name._M_dataplus._M_p =
           (pointer)&local_308.super_FeatureDescriptor.Name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"CMAKE_LINK_OBJECT_FILE_FLAG","");
      cmMakefile::GetSafeDefinition(pcVar10,(string *)&local_308);
      std::__cxx11::string::_M_assign(local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.Name.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign(local_230);
    }
    this->RuntimeUseChrpath = false;
    TVar8 = cmGeneratorTarget::GetType(this->Target);
    if (TVar8 != STATIC_LIBRARY) {
      TVar8 = cmGeneratorTarget::GetType(this->Target);
      pcVar17 = "SHARED_LIBRARY";
      if (TVar8 == EXECUTABLE) {
        pcVar17 = "EXECUTABLE";
      }
      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity =
           (ulong)(TVar8 != EXECUTABLE) * 4 + 10;
      local_308.super_FeatureDescriptor.Name._M_dataplus._M_p = (pointer)0x6;
      local_308.super_FeatureDescriptor.Name._M_string_length = 0x6f7ef9;
      local_308.super_FeatureDescriptor.Supported = true;
      local_308.super_FeatureDescriptor._33_7_ = 0;
      local_308.super_FeatureDescriptor.Prefix._M_dataplus._M_p = "_RUNTIME_";
      local_308.super_FeatureDescriptor.Prefix.field_2._M_allocated_capacity =
           (size_type)(this->LinkLanguage)._M_dataplus._M_p;
      local_308.super_FeatureDescriptor.Prefix._M_string_length =
           (this->LinkLanguage)._M_string_length;
      local_308.super_FeatureDescriptor.Prefix.field_2._8_8_ = 5;
      local_308.super_FeatureDescriptor.Suffix._M_dataplus._M_p = "_FLAG";
      views_00._M_len = 5;
      views_00._M_array = (iterator)&local_308;
      local_308.super_FeatureDescriptor.Name.field_2._8_8_ = pcVar17;
      cmCatViews_abi_cxx11_((string *)local_328,views_00);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,local_328._0_8_,
                 (pointer)(local_328._0_8_ + (long)(_Alloc_hider *)local_328._8_8_));
      std::__cxx11::string::append((char *)&local_208);
      cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_328);
      std::__cxx11::string::_M_assign(local_168);
      cmMakefile::GetSafeDefinition(this->Makefile,&local_208);
      std::__cxx11::string::_M_assign(local_170);
      pcVar10 = this->Makefile;
      local_308.super_FeatureDescriptor.Name._M_dataplus._M_p =
           (pointer)&local_308.super_FeatureDescriptor.Name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"CMAKE_PLATFORM_REQUIRED_RUNTIME_PATH","");
      cmMakefile::GetSafeDefinition(pcVar10,(string *)&local_308);
      std::__cxx11::string::_M_assign(local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.Name.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
      }
      bVar7 = cmGeneratorTarget::IsChrpathUsed(this->Target,config);
      this->RuntimeUseChrpath = bVar7;
      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity =
           (ulong)(TVar8 != EXECUTABLE) * 4 + 10;
      local_308.super_FeatureDescriptor.Name._M_dataplus._M_p = (pointer)0x6;
      local_308.super_FeatureDescriptor.Name._M_string_length = 0x6f7ef9;
      local_308.super_FeatureDescriptor.Supported = true;
      local_308.super_FeatureDescriptor._33_7_ = 0;
      local_308.super_FeatureDescriptor.Prefix._M_dataplus._M_p = "_RPATH_LINK_";
      local_308.super_FeatureDescriptor.Prefix.field_2._M_allocated_capacity =
           (size_type)(this->LinkLanguage)._M_dataplus._M_p;
      local_308.super_FeatureDescriptor.Prefix._M_string_length =
           (this->LinkLanguage)._M_string_length;
      local_308.super_FeatureDescriptor.Prefix.field_2._8_8_ = 5;
      local_308.super_FeatureDescriptor.Suffix._M_dataplus._M_p = "_FLAG";
      views_01._M_len = 5;
      views_01._M_array = (iterator)&local_308;
      local_308.super_FeatureDescriptor.Name.field_2._8_8_ = pcVar17;
      cmCatViews_abi_cxx11_(&local_50,views_01);
      cmMakefile::GetSafeDefinition(this->Makefile,&local_50);
      std::__cxx11::string::_M_assign(local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
        operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
      }
    }
    local_308.super_FeatureDescriptor.Name.field_2._8_8_ = (this->LinkLanguage)._M_dataplus._M_p;
    local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity =
         (this->LinkLanguage)._M_string_length;
    local_308.super_FeatureDescriptor.Name._M_dataplus._M_p = (pointer)0x1a;
    local_308.super_FeatureDescriptor.Name._M_string_length = 0x6ef0ed;
    local_308.super_FeatureDescriptor.Supported = true;
    local_308.super_FeatureDescriptor._33_7_ = 0;
    local_308.super_FeatureDescriptor.Prefix._M_dataplus._M_p = "_WITH_RUNTIME_PATH";
    views_02._M_len = 3;
    views_02._M_array = (iterator)&local_308;
    cmCatViews_abi_cxx11_((string *)local_328,views_02);
    bVar7 = cmMakefile::IsOn(this->Makefile,(string *)local_328);
    this->LinkWithRuntimePath = bVar7;
    if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    if ((this->LibLinkFileFlag)._M_string_length != 0) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"__CMAKE_LINK_LIBRARY","")
      ;
      local_328._8_8_ = (this->LibLinkFileFlag)._M_dataplus._M_p;
      local_328._0_8_ = (this->LibLinkFileFlag)._M_string_length;
      local_328._16_8_ = 9;
      local_328._24_8_ = "<LIBRARY>";
      views_03._M_len = 2;
      views_03._M_array = (iterator)local_328;
      cmCatViews_abi_cxx11_(&local_70,views_03);
      LibraryFeatureDescriptor::LibraryFeatureDescriptor(&local_308,&local_d0,&local_70);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
      ::_M_emplace_unique<char_const(&)[21],cmComputeLinkInformation::LibraryFeatureDescriptor>
                (local_258,(char (*) [21])"__CMAKE_LINK_LIBRARY",&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.ItemNameFormat._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.ItemNameFormat.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.ItemNameFormat._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.ItemNameFormat.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.ItemPathFormat._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.ItemPathFormat.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.ItemPathFormat._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.ItemPathFormat.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.Suffix._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.Suffix.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.Suffix._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.Suffix.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.Prefix._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.Prefix.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.Prefix._M_dataplus._M_p,
                        (ulong)(local_308.super_FeatureDescriptor.Prefix.field_2.
                                _M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.Name.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((this->ObjLinkFileFlag)._M_string_length != 0) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"__CMAKE_LINK_OBJECT","");
      local_328._8_8_ = (this->ObjLinkFileFlag)._M_dataplus._M_p;
      local_328._0_8_ = (this->ObjLinkFileFlag)._M_string_length;
      local_328._16_8_ = 9;
      local_328._24_8_ = "<LIBRARY>";
      views_04._M_len = 2;
      views_04._M_array = (iterator)local_328;
      cmCatViews_abi_cxx11_(&local_90,views_04);
      LibraryFeatureDescriptor::LibraryFeatureDescriptor(&local_308,&local_f0,&local_90);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
      ::_M_emplace_unique<char_const(&)[20],cmComputeLinkInformation::LibraryFeatureDescriptor>
                (local_258,(char (*) [20])"__CMAKE_LINK_OBJECT",&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.ItemNameFormat._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.ItemNameFormat.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.ItemNameFormat._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.ItemNameFormat.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.ItemPathFormat._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.ItemPathFormat.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.ItemPathFormat._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.ItemPathFormat.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.Suffix._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.Suffix.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.Suffix._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.Suffix.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.Prefix._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.Prefix.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.Prefix._M_dataplus._M_p,
                        (ulong)(local_308.super_FeatureDescriptor.Prefix.field_2.
                                _M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.Name.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
    }
    psVar15 = (this->LoaderFlag).Value;
    if (psVar15 == (string *)0x0) {
      psVar15 = &cmValue::Empty_abi_cxx11_;
    }
    if (psVar15->_M_string_length != 0) {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,"__CMAKE_LINK_EXECUTABLE","");
      psVar15 = (this->LoaderFlag).Value;
      if (psVar15 == (string *)0x0) {
        psVar15 = &cmValue::Empty_abi_cxx11_;
      }
      local_328._8_8_ = (psVar15->_M_dataplus)._M_p;
      local_328._0_8_ = psVar15->_M_string_length;
      local_328._16_8_ = 9;
      local_328._24_8_ = "<LIBRARY>";
      views_05._M_len = 2;
      views_05._M_array = (iterator)local_328;
      cmCatViews_abi_cxx11_(&local_b0,views_05);
      LibraryFeatureDescriptor::LibraryFeatureDescriptor(&local_308,&local_110,&local_b0);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
      ::_M_emplace_unique<char_const(&)[24],cmComputeLinkInformation::LibraryFeatureDescriptor>
                (local_258,(char (*) [24])"__CMAKE_LINK_EXECUTABLE",&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.ItemNameFormat._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.ItemNameFormat.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.ItemNameFormat._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.ItemNameFormat.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.ItemPathFormat._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.ItemPathFormat.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.ItemPathFormat._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.ItemPathFormat.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.Suffix._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.Suffix.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.Suffix._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.Suffix.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.Prefix._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.Prefix.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.Prefix._M_dataplus._M_p,
                        (ulong)(local_308.super_FeatureDescriptor.Prefix.field_2.
                                _M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.Name.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"__CMAKE_LINK_FRAMEWORK","");
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"<LIBRARY>","");
    LibraryFeatureDescriptor::LibraryFeatureDescriptor(&local_308,&local_130,&local_150);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
    ::_M_emplace_unique<char_const(&)[23],cmComputeLinkInformation::LibraryFeatureDescriptor>
              (local_258,(char (*) [23])"__CMAKE_LINK_FRAMEWORK",&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.super_FeatureDescriptor.ItemNameFormat._M_dataplus._M_p !=
        &local_308.super_FeatureDescriptor.ItemNameFormat.field_2) {
      operator_delete(local_308.super_FeatureDescriptor.ItemNameFormat._M_dataplus._M_p,
                      local_308.super_FeatureDescriptor.ItemNameFormat.field_2._M_allocated_capacity
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.super_FeatureDescriptor.ItemPathFormat._M_dataplus._M_p !=
        &local_308.super_FeatureDescriptor.ItemPathFormat.field_2) {
      operator_delete(local_308.super_FeatureDescriptor.ItemPathFormat._M_dataplus._M_p,
                      local_308.super_FeatureDescriptor.ItemPathFormat.field_2._M_allocated_capacity
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.super_FeatureDescriptor.Suffix._M_dataplus._M_p !=
        &local_308.super_FeatureDescriptor.Suffix.field_2) {
      operator_delete(local_308.super_FeatureDescriptor.Suffix._M_dataplus._M_p,
                      local_308.super_FeatureDescriptor.Suffix.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.super_FeatureDescriptor.Prefix._M_dataplus._M_p !=
        &local_308.super_FeatureDescriptor.Prefix.field_2) {
      operator_delete(local_308.super_FeatureDescriptor.Prefix._M_dataplus._M_p,
                      (ulong)(local_308.super_FeatureDescriptor.Prefix.field_2._M_allocated_capacity
                             + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
        &local_308.super_FeatureDescriptor.Name.field_2) {
      operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    pcVar10 = this->Makefile;
    local_308.super_FeatureDescriptor.Name._M_dataplus._M_p =
         (pointer)&local_308.super_FeatureDescriptor.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,"CMAKE_PLATFORM_USES_PATH_WHEN_NO_SONAME","");
    bVar7 = cmMakefile::IsOn(pcVar10,(string *)&local_308);
    this->NoSONameUsesPath = bVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
        &local_308.super_FeatureDescriptor.Name.field_2) {
      operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
    }
    ComputeLinkTypeInfo(this);
    ComputeItemParserInfo(this);
    ComputeFrameworkInfo(this);
    this->SharedDependencyMode = SharedDepModeNone;
    pcVar10 = this->Makefile;
    local_308.super_FeatureDescriptor.Name._M_dataplus._M_p =
         (pointer)&local_308.super_FeatureDescriptor.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,"CMAKE_LINK_DEPENDENT_LIBRARY_FILES","");
    bVar7 = cmMakefile::IsOn(pcVar10,(string *)&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
        &local_308.super_FeatureDescriptor.Name.field_2) {
      operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) {
      this->SharedDependencyMode = SharedDepModeLink;
    }
    else {
      pcVar10 = this->Makefile;
      local_308.super_FeatureDescriptor.Name._M_dataplus._M_p =
           (pointer)&local_308.super_FeatureDescriptor.Name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"CMAKE_LINK_DEPENDENT_LIBRARY_DIRS","");
      bVar7 = cmMakefile::IsOn(pcVar10,(string *)&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
          &local_308.super_FeatureDescriptor.Name.field_2) {
        operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                        local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
      }
      if (bVar7) {
        this->SharedDependencyMode = SharedDepModeLibDir;
      }
      else if ((this->RPathLinkFlag)._M_string_length != 0) {
        this->SharedDependencyMode = SharedDepModeDir;
        pcVar12 = (cmOrderDirectories *)operator_new(0x2d0);
        cmOrderDirectories::cmOrderDirectories
                  (pcVar12,this->GlobalGenerator,target,"dependent library path");
        local_308.super_FeatureDescriptor.Name._M_dataplus._M_p = (pointer)0x0;
        std::__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::reset
                  ((__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)
                   local_250,pcVar12);
        std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::~unique_ptr
                  ((unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)
                   &local_308);
      }
    }
    local_328._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_328._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_328._16_8_ = 0;
    cmGeneratorTarget::GetLinkDirectories
              (this->Target,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_328,config,local_260);
    cmOrderDirectories::AddUserDirectories
              ((local_238->_M_t).
               super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
               .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_328);
    cmOrderDirectories::AddUserDirectories
              ((local_240->_M_t).
               super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
               .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_328);
    LoadImplicitLinkInfo(this);
    cmOrderDirectories::SetImplicitDirectories
              ((local_238->_M_t).
               super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
               .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,local_248);
    cmOrderDirectories::SetImplicitDirectories
              ((local_240->_M_t).
               super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
               .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,local_248);
    pcVar12 = (local_250->_M_t).
              super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
              _M_t.
              super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
              .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl;
    if (pcVar12 != (cmOrderDirectories *)0x0) {
      cmOrderDirectories::SetImplicitDirectories(pcVar12,local_248);
      cmOrderDirectories::AddLanguageDirectories
                ((local_250->_M_t).
                 super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
                 .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,local_160);
    }
    PVar9 = cmPolicies::PolicyMap::Get(&this->Target->PolicyMap,CMP0003);
    uVar6 = local_328._8_8_;
    this->OldLinkDirMode = PVar9 != NEW;
    if (PVar9 != NEW) {
      local_308.super_FeatureDescriptor.Name._M_dataplus._M_p = (pointer)local_210;
      if (local_328._0_8_ != local_328._8_8_) {
        __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_;
        do {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::
          _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                    (local_210,(const_iterator)p_Var1,__v,(_Alloc_node *)&local_308);
          __v = __v + 1;
        } while (__v != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar6);
      }
    }
    pcVar10 = this->Makefile;
    local_308.super_FeatureDescriptor.Name._M_dataplus._M_p =
         (pointer)&local_308.super_FeatureDescriptor.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,"CMAKE_POLICY_WARNING_CMP0060","");
    bVar7 = cmMakefile::PolicyOptionalWarningEnabled(pcVar10,(string *)&local_308);
    this->CMP0060Warn = bVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.super_FeatureDescriptor.Name._M_dataplus._M_p !=
        &local_308.super_FeatureDescriptor.Name.field_2) {
      operator_delete(local_308.super_FeatureDescriptor.Name._M_dataplus._M_p,
                      local_308.super_FeatureDescriptor.Name.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_328);
  }
  return;
}

Assistant:

cmComputeLinkInformation::cmComputeLinkInformation(
  const cmGeneratorTarget* target, const std::string& config)
  // Store context information.
  : Target(target)
  , Makefile(target->Target->GetMakefile())
  , GlobalGenerator(target->GetLocalGenerator()->GetGlobalGenerator())
  , CMakeInstance(this->GlobalGenerator->GetCMakeInstance())
  // The configuration being linked.
  , Config(config)
{
  // Check whether to recognize OpenBSD-style library versioned names.
  this->OpenBSD = this->Makefile->GetState()->GetGlobalPropertyAsBool(
    "FIND_LIBRARY_USE_OPENBSD_VERSIONING");

  // Allocate internals.
  this->OrderLinkerSearchPath = cm::make_unique<cmOrderDirectories>(
    this->GlobalGenerator, target, "linker search path");
  this->OrderRuntimeSearchPath = cm::make_unique<cmOrderDirectories>(
    this->GlobalGenerator, target, "runtime search path");

  // Get the language used for linking this target.
  this->LinkLanguage = this->Target->GetLinkerLanguage(config);
  if (this->LinkLanguage.empty()) {
    // The Compute method will do nothing, so skip the rest of the
    // initialization.
    return;
  }

  // Check whether we should skip dependencies on shared library files.
  this->LinkDependsNoShared =
    this->Target->GetPropertyAsBool("LINK_DEPENDS_NO_SHARED");

  // On platforms without import libraries there may be a special flag
  // to use when creating a plugin (module) that obtains symbols from
  // the program that will load it.
  if (!this->Target->IsDLLPlatform() &&
      this->Target->GetType() == cmStateEnums::MODULE_LIBRARY) {
    std::string loader_flag_var =
      cmStrCat("CMAKE_SHARED_MODULE_LOADER_", this->LinkLanguage, "_FLAG");
    this->LoaderFlag = this->Makefile->GetDefinition(loader_flag_var);
  }

  // Get options needed to link libraries.
  if (cmValue flag = this->Makefile->GetDefinition(
        "CMAKE_" + this->LinkLanguage + "_LINK_LIBRARY_FLAG")) {
    this->LibLinkFlag = *flag;
  } else {
    this->LibLinkFlag =
      this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_FLAG");
  }
  if (cmValue flag = this->Makefile->GetDefinition(
        "CMAKE_" + this->LinkLanguage + "_LINK_LIBRARY_FILE_FLAG")) {
    this->LibLinkFileFlag = *flag;
  } else {
    this->LibLinkFileFlag =
      this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_FILE_FLAG");
  }
  if (cmValue suffix = this->Makefile->GetDefinition(
        "CMAKE_" + this->LinkLanguage + "_LINK_LIBRARY_SUFFIX")) {
    this->LibLinkSuffix = *suffix;
  } else {
    this->LibLinkSuffix =
      this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_SUFFIX");
  }
  if (cmValue flag = this->Makefile->GetDefinition(
        "CMAKE_" + this->LinkLanguage + "_LINK_OBJECT_FILE_FLAG")) {
    this->ObjLinkFileFlag = *flag;
  } else {
    this->ObjLinkFileFlag =
      this->Makefile->GetSafeDefinition("CMAKE_LINK_OBJECT_FILE_FLAG");
  }

  // Get options needed to specify RPATHs.
  this->RuntimeUseChrpath = false;
  if (this->Target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    const char* tType = ((this->Target->GetType() == cmStateEnums::EXECUTABLE)
                           ? "EXECUTABLE"
                           : "SHARED_LIBRARY");
    std::string rtVar =
      cmStrCat("CMAKE_", tType, "_RUNTIME_", this->LinkLanguage, "_FLAG");
    std::string rtSepVar = rtVar + "_SEP";
    this->RuntimeFlag = this->Makefile->GetSafeDefinition(rtVar);
    this->RuntimeSep = this->Makefile->GetSafeDefinition(rtSepVar);
    this->RuntimeAlways = (this->Makefile->GetSafeDefinition(
      "CMAKE_PLATFORM_REQUIRED_RUNTIME_PATH"));

    this->RuntimeUseChrpath = this->Target->IsChrpathUsed(config);

    // Get options needed to help find dependent libraries.
    std::string rlVar =
      cmStrCat("CMAKE_", tType, "_RPATH_LINK_", this->LinkLanguage, "_FLAG");
    this->RPathLinkFlag = this->Makefile->GetSafeDefinition(rlVar);
  }

  // Check if we need to include the runtime search path at link time.
  {
    std::string var = cmStrCat("CMAKE_SHARED_LIBRARY_LINK_",
                               this->LinkLanguage, "_WITH_RUNTIME_PATH");
    this->LinkWithRuntimePath = this->Makefile->IsOn(var);
  }

  // Define some Feature descriptors to handle standard library and object link
  if (!this->GetLibLinkFileFlag().empty()) {
    this->LibraryFeatureDescriptors.emplace(
      "__CMAKE_LINK_LIBRARY",
      LibraryFeatureDescriptor{
        "__CMAKE_LINK_LIBRARY",
        cmStrCat(this->GetLibLinkFileFlag(), "<LIBRARY>") });
  }
  if (!this->GetObjLinkFileFlag().empty()) {
    this->LibraryFeatureDescriptors.emplace(
      "__CMAKE_LINK_OBJECT",
      LibraryFeatureDescriptor{
        "__CMAKE_LINK_OBJECT",
        cmStrCat(this->GetObjLinkFileFlag(), "<LIBRARY>") });
  }
  if (!this->LoaderFlag->empty()) {
    // Define a Feature descriptor for the link of an executable with exports
    this->LibraryFeatureDescriptors.emplace(
      "__CMAKE_LINK_EXECUTABLE",
      LibraryFeatureDescriptor{ "__CMAKE_LINK_EXECUTABLE",
                                cmStrCat(this->LoaderFlag, "<LIBRARY>") });
  }
  // To link framewortk using a full path
  this->LibraryFeatureDescriptors.emplace(
    "__CMAKE_LINK_FRAMEWORK",
    LibraryFeatureDescriptor{ "__CMAKE_LINK_FRAMEWORK", "<LIBRARY>" });

  // Check the platform policy for missing soname case.
  this->NoSONameUsesPath =
    this->Makefile->IsOn("CMAKE_PLATFORM_USES_PATH_WHEN_NO_SONAME");

  // Get link type information.
  this->ComputeLinkTypeInfo();

  // Setup the link item parser.
  this->ComputeItemParserInfo();

  // Setup framework support.
  this->ComputeFrameworkInfo();

  // Choose a mode for dealing with shared library dependencies.
  this->SharedDependencyMode = SharedDepModeNone;
  if (this->Makefile->IsOn("CMAKE_LINK_DEPENDENT_LIBRARY_FILES")) {
    this->SharedDependencyMode = SharedDepModeLink;
  } else if (this->Makefile->IsOn("CMAKE_LINK_DEPENDENT_LIBRARY_DIRS")) {
    this->SharedDependencyMode = SharedDepModeLibDir;
  } else if (!this->RPathLinkFlag.empty()) {
    this->SharedDependencyMode = SharedDepModeDir;
    this->OrderDependentRPath = cm::make_unique<cmOrderDirectories>(
      this->GlobalGenerator, target, "dependent library path");
  }

  // Add the search path entries requested by the user to path ordering.
  std::vector<std::string> directories;
  this->Target->GetLinkDirectories(directories, config, this->LinkLanguage);
  this->OrderLinkerSearchPath->AddUserDirectories(directories);
  this->OrderRuntimeSearchPath->AddUserDirectories(directories);

  // Set up the implicit link directories.
  this->LoadImplicitLinkInfo();
  this->OrderLinkerSearchPath->SetImplicitDirectories(this->ImplicitLinkDirs);
  this->OrderRuntimeSearchPath->SetImplicitDirectories(this->ImplicitLinkDirs);
  if (this->OrderDependentRPath) {
    this->OrderDependentRPath->SetImplicitDirectories(this->ImplicitLinkDirs);
    this->OrderDependentRPath->AddLanguageDirectories(this->RuntimeLinkDirs);
  }

  // Decide whether to enable compatible library search path mode.
  // There exists code that effectively does
  //
  //    /path/to/libA.so -lB
  //
  // where -lB is meant to link to /path/to/libB.so.  This is broken
  // because it specified -lB without specifying a link directory (-L)
  // in which to search for B.  This worked in CMake 2.4 and below
  // because -L/path/to would be added by the -L/-l split for A.  In
  // order to support such projects we need to add the directories
  // containing libraries linked with a full path to the -L path.
  this->OldLinkDirMode =
    this->Target->GetPolicyStatusCMP0003() != cmPolicies::NEW;
  if (this->OldLinkDirMode) {
    // Construct a mask to not bother with this behavior for link
    // directories already specified by the user.
    this->OldLinkDirMask.insert(directories.begin(), directories.end());
  }

  this->CMP0060Warn = this->Makefile->PolicyOptionalWarningEnabled(
    "CMAKE_POLICY_WARNING_CMP0060");
}